

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::reportError(Parser *this,ParserException *ex)

{
  ParserInputState *pPVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pPVar1 = ((this->inputState).ref)->ptr;
  pcVar2 = (pPVar1->filename)._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (pPVar1->filename)._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)&local_68);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: ",7);
    (**(code **)(*(long *)&ex->super_ANTLRException + 0x18))(&local_68,ex);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_68,local_60);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error in ",9);
    pPVar1 = ((this->inputState).ref)->ptr;
    pcVar2 = (pPVar1->filename)._M_dataplus._M_p;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + (pPVar1->filename)._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_68,local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    (**(code **)(*(long *)&ex->super_ANTLRException + 0x18))(&local_48,ex);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_48,local_40);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

void Parser::reportError(const ParserException& ex)
{
	if ( getFilename()=="" )
		std::cout << "Error: " << ex.toString() << std::endl;
	else
		std::cout << "Error in " << getFilename() << ": " << ex.toString() << std::endl;
}